

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_keywrap.c
# Opt level: O0

int keyWrapCryptoPro(gost_ctx *ctx,uchar *keyExchangeKey,uchar *ukm,uchar *sessionKey,
                    uchar *wrappedKey)

{
  uchar *in_RCX;
  uchar *in_RDX;
  gost_ctx *in_RSI;
  uchar *in_R8;
  uchar kek_ukm [32];
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  gost_ctx *in_stack_ffffffffffffffc0;
  uchar *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  
  keyDiversifyCryptoPro(in_RSI,in_RDX,in_RCX,in_R8);
  gost_key(in_stack_ffffffffffffffc0,
           (byte *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  *(undefined8 *)in_R8 = *(undefined8 *)in_RDX;
  gost_enc((gost_ctx *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
           in_stack_ffffffffffffffc8,(byte *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  gost_mac_iv(in_RSI,(int)((ulong)in_RDX >> 0x20),in_RCX,in_R8,in_stack_ffffffffffffffd4,
              in_stack_ffffffffffffffc8);
  return 1;
}

Assistant:

int keyWrapCryptoPro(gost_ctx * ctx, const unsigned char *keyExchangeKey,
                     const unsigned char *ukm,
                     const unsigned char *sessionKey,
                     unsigned char *wrappedKey)
{
    unsigned char kek_ukm[32];
    keyDiversifyCryptoPro(ctx, keyExchangeKey, ukm, kek_ukm);
    gost_key(ctx, kek_ukm);
    memcpy(wrappedKey, ukm, 8);
    gost_enc(ctx, sessionKey, wrappedKey + 8, 4);
    gost_mac_iv(ctx, 32, ukm, sessionKey, 32, wrappedKey + 40);
    return 1;
}